

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

Error asmjit::formatFuncRets
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,FuncDetail *fd,
                VirtReg **vRegs)

{
  Error EVar1;
  StringBuilder *in_RCX;
  size_t in_RDX;
  undefined4 in_ESI;
  StringBuilder *in_RDI;
  long in_R8;
  Error _err_2;
  Error _err_1;
  Error _err;
  uint32_t i;
  char *in_stack_00000330;
  int in_stack_0000033c;
  char *in_stack_00000340;
  undefined4 in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  StringBuilder *in_stack_ffffffffffffff58;
  Value in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  Error in_stack_ffffffffffffff6c;
  uint local_8c;
  Error local_5c;
  
  if (*(char *)((long)&in_RCX[2]._length + 1) == '\0') {
    local_5c = StringBuilder::_opString
                         ((StringBuilder *)
                          CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                          in_stack_ffffffffffffff64._value,(char *)in_stack_ffffffffffffff58,
                          in_stack_ffffffffffffff50);
  }
  else {
    for (local_8c = 0; local_8c < *(byte *)((long)&in_RCX[2]._length + 1); local_8c = local_8c + 1)
    {
      if ((local_8c != 0) &&
         (EVar1 = StringBuilder::_opString
                            ((StringBuilder *)
                             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                             in_stack_ffffffffffffff64._value,(char *)in_stack_ffffffffffffff58,
                             in_stack_ffffffffffffff50), EVar1 != 0)) {
        return EVar1;
      }
      if (1 < (ulong)local_8c) {
        DebugUtils::assertionFailed(in_stack_00000340,in_stack_0000033c,in_stack_00000330);
      }
      in_stack_ffffffffffffff68 = *(undefined4 *)((long)&in_RCX[3]._data + (ulong)local_8c * 4);
      in_stack_ffffffffffffff50 = in_RDX;
      in_stack_ffffffffffffff58 = in_RCX;
      in_stack_ffffffffffffff6c =
           formatFuncDetailValue
                     (in_RCX,(uint32_t)(in_RDX >> 0x20),
                      (CodeEmitter *)CONCAT44(in_ESI,in_stack_ffffffffffffff48),
                      in_stack_ffffffffffffff64);
      if (in_stack_ffffffffffffff6c != 0) {
        return in_stack_ffffffffffffff6c;
      }
      if (in_R8 != 0) {
        EVar1 = StringBuilder::appendFormat
                          (in_RDI," {%s}",
                           *(undefined8 *)(*(long *)(in_R8 + (ulong)local_8c * 8) + 8));
        if (EVar1 != 0) {
          return EVar1;
        }
        in_stack_ffffffffffffff64._value = 0;
      }
    }
    local_5c = 0;
  }
  return local_5c;
}

Assistant:

static Error formatFuncRets(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  const FuncDetail& fd,
  VirtReg* const* vRegs) noexcept {

  if (!fd.hasRet())
    return sb.appendString("void");

  for (uint32_t i = 0; i < fd.getRetCount(); i++) {
    if (i) ASMJIT_PROPAGATE(sb.appendString(", "));
    ASMJIT_PROPAGATE(formatFuncDetailValue(sb, logOptions, emitter, fd.getRet(i)));

#if !defined(ASMJIT_DISABLE_COMPILER)
    if (vRegs)
      ASMJIT_PROPAGATE(sb.appendFormat(" {%s}", vRegs[i]->getName()));
#endif // !ASMJIT_DISABLE_COMPILER
  }

  return kErrorOk;
}